

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.hpp
# Opt level: O1

void __thiscall
asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>&>::
set_verify_callback<std::_Bind<bool(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client*,std::_Placeholder<1>,std::_Placeholder<2>))(bool,asio::ssl::verify_context&)>>
          (stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>&> *this,
          _Bind<bool_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(bool,_asio::ssl::verify_context_&)>
          *callback)

{
  error_code __ec;
  error_code ec;
  error_code local_68;
  system_error local_58 [32];
  _Bind<bool_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(bool,_asio::ssl::verify_context_&)>
  local_38;
  
  local_68._M_value = 0;
  local_68._M_cat = (error_category *)std::_V2::system_category();
  local_38._M_f = callback->_M_f;
  local_38._8_8_ = *(undefined8 *)&callback->field_0x8;
  local_38._M_bound_args.
  super__Tuple_impl<0UL,_nuraft::asio_rpc_client_*,_std::_Placeholder<1>,_std::_Placeholder<2>_>.
  super__Head_base<0UL,_nuraft::asio_rpc_client_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_nuraft::asio_rpc_client_*,_std::_Placeholder<1>,_std::_Placeholder<2>_>)
       (callback->_M_bound_args).
       super__Tuple_impl<0UL,_nuraft::asio_rpc_client_*,_std::_Placeholder<1>,_std::_Placeholder<2>_>
       .super__Head_base<0UL,_nuraft::asio_rpc_client_*,_false>._M_head_impl;
  set_verify_callback<std::_Bind<bool(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client*,std::_Placeholder<1>,std::_Placeholder<2>))(bool,asio::ssl::verify_context&)>>
            (this,&local_38,&local_68);
  __ec._4_4_ = 0;
  __ec._M_value = local_68._M_value;
  if (local_68._M_value != 0) {
    __ec._M_cat = local_68._M_cat;
    std::system_error::system_error(local_58,__ec,"set_verify_callback");
    asio::detail::throw_exception<std::system_error>(local_58);
    std::system_error::~system_error(local_58);
  }
  return;
}

Assistant:

void set_verify_callback(VerifyCallback callback)
  {
    asio::error_code ec;
    this->set_verify_callback(callback, ec);
    asio::detail::throw_error(ec, "set_verify_callback");
  }